

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void stbtt_GetPackedQuad(stbtt_packedchar *chardata,int pw,int ph,int char_index,float *xpos,
                        float *ypos,stbtt_aligned_quad *q,int align_to_integer)

{
  stbtt_packedchar *psVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  
  psVar1 = chardata + char_index;
  fVar2 = chardata[char_index].xoff;
  fVar5 = *xpos + fVar2;
  if (align_to_integer == 0) {
    q->x0 = fVar5;
    q->y0 = *ypos + psVar1->yoff;
    q->x1 = *xpos + psVar1->xoff2;
    fVar7 = *ypos + psVar1->yoff2;
  }
  else {
    fVar7 = psVar1->yoff;
    fVar6 = *ypos;
    fVar5 = floorf(fVar5 + 0.5);
    fVar6 = floorf(fVar6 + fVar7 + 0.5);
    q->x0 = (float)(int)fVar5;
    q->y0 = (float)(int)fVar6;
    q->x1 = (psVar1->xoff2 + (float)(int)fVar5) - fVar2;
    fVar7 = ((float)(int)fVar6 + psVar1->yoff2) - fVar7;
  }
  q->y1 = fVar7;
  auVar8._0_4_ = (float)pw;
  auVar8._4_4_ = (float)ph;
  auVar8._8_8_ = 0;
  auVar8 = divps(_DAT_0015c250,auVar8);
  uVar3._0_2_ = psVar1->x0;
  uVar3._2_2_ = psVar1->y0;
  q->s0 = (float)(uVar3 & 0xffff) * auVar8._0_4_;
  q->t0 = (float)(uVar3 >> 0x10) * auVar8._4_4_;
  uVar4._0_2_ = psVar1->x1;
  uVar4._2_2_ = psVar1->y1;
  q->s1 = (float)(uVar4 & 0xffff) * auVar8._0_4_;
  q->t1 = (float)(uVar4 >> 0x10) * auVar8._4_4_;
  *xpos = psVar1->xadvance + *xpos;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetPackedQuad(const stbtt_packedchar *chardata, int pw, int ph, int char_index, float *xpos, float *ypos, stbtt_aligned_quad *q, int align_to_integer)
{
float ipw = 1.0f / pw, iph = 1.0f / ph;
const stbtt_packedchar *b = chardata + char_index;

if (align_to_integer) {
float x = (float) STBTT_ifloor((*xpos + b->xoff) + 0.5f);
float y = (float) STBTT_ifloor((*ypos + b->yoff) + 0.5f);
q->x0 = x;
q->y0 = y;
q->x1 = x + b->xoff2 - b->xoff;
q->y1 = y + b->yoff2 - b->yoff;
} else {
q->x0 = *xpos + b->xoff;
q->y0 = *ypos + b->yoff;
q->x1 = *xpos + b->xoff2;
q->y1 = *ypos + b->yoff2;
}

q->s0 = b->x0 * ipw;
q->t0 = b->y0 * iph;
q->s1 = b->x1 * ipw;
q->t1 = b->y1 * iph;

*xpos += b->xadvance;
}